

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O3

void __thiscall Wasm::WasmBinaryReader::ReadGlobalSection(WasmBinaryReader *this)

{
  code *pcVar1;
  WasmNode init;
  char binType;
  bool bVar2;
  uint uVar3;
  uint32 uVar4;
  WasmType type;
  WasmType WVar5;
  WasmGlobal *pWVar6;
  undefined4 *puVar7;
  Type refType;
  char16_t *msg;
  char *this_00;
  undefined1 auStack_58 [8];
  WasmNode globalNode;
  uint32 len;
  
  globalNode.field_1._20_4_ = 0;
  uVar3 = LEB128<unsigned_int,32u>(this,(uint32 *)((long)&globalNode.field_1 + 0x14));
  this_00 = (char *)this->m_module;
  uVar4 = Js::WebAssemblyModule::GetGlobalCount((WebAssemblyModule *)this_00);
  if ((CARRY4(uVar4,uVar3)) || ((1000000 < uVar4 + uVar3 && (DAT_015932e2 == '\0')))) {
    msg = L"Too many globals";
  }
  else {
    while( true ) {
      if (uVar3 == 0) {
        return;
      }
      binType = LEB128<char,7u>(this,(uint32 *)((long)&globalNode.field_1 + 0x14));
      type = LanguageTypes::ToWasmType(binType);
      this_00 = (char *)(ulong)type;
      bVar2 = WasmTypes::IsLocalType(type);
      if (!bVar2) {
        ThrowDecodingError((WasmBinaryReader *)this_00,L"Invalid global type %u",(ulong)type);
      }
      if (3 < type - FirstLocalType) break;
      bVar2 = ReadMutableValue(this);
      this_00 = auStack_58;
      ReadInitExpr((WasmNode *)this_00,this,false);
      refType = Const;
      switch(auStack_58._0_2_) {
      case 0x41:
        WVar5 = FirstLocalType;
        break;
      case 0x42:
        WVar5 = I64;
        break;
      case 0x43:
        WVar5 = F32;
        break;
      case 0x44:
        WVar5 = F64;
        break;
      default:
        if (auStack_58._0_2_ != 0x23) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          this_00 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmBinaryReader.cpp"
          ;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmBinaryReader.cpp"
                             ,0x44f,"((0))","UNREACHED");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar7 = 0;
          msg = L"Unknown global init_expr";
          goto LAB_00f12f6e;
        }
        this_00 = (char *)this->m_module;
        pWVar6 = Js::WebAssemblyModule::GetGlobal((WebAssemblyModule *)this_00,globalNode._0_4_);
        WVar5 = pWVar6->m_type;
        refType = LocalReference;
      }
      if (type != WVar5) {
        msg = L"Type mismatch for global initialization";
        goto LAB_00f12f6e;
      }
      init._2_6_ = auStack_58._2_6_;
      init.op = auStack_58._0_2_;
      init.field_1.block.field_1 = (anon_union_4_2_52a1cc71_for_WasmBlock_1)globalNode._4_4_;
      init.field_1.br.depth = (WasmBrNode)(WasmBrNode)globalNode._0_4_;
      init.field_1._8_8_ = globalNode.field_1.block;
      init.field_1._16_8_ = globalNode.field_1.brTable.targetTable;
      Js::WebAssemblyModule::AddGlobal(this->m_module,refType,type,bVar2,init);
      uVar3 = uVar3 - 1;
    }
    if (type != V128) {
      WasmTypes::
      CompileAssertCases<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
                ();
    }
    msg = L"v128 globals not supported";
  }
LAB_00f12f6e:
  ThrowDecodingError((WasmBinaryReader *)this_00,msg);
}

Assistant:

void WasmBinaryReader::ReadGlobalSection()
{
    uint32 len = 0;
    uint32 numGlobals = LEB128(len);

    uint32 totalGlobals = 0;
    if (UInt32Math::Add(numGlobals, m_module->GetGlobalCount(), &totalGlobals) || totalGlobals > Limits::GetMaxGlobals())
    {
        ThrowDecodingError(_u("Too many globals"));
    }

    for (uint32 i = 0; i < numGlobals; ++i)
    {
        WasmTypes::WasmType type = ReadWasmType(len);
        
        if (!WasmTypes::IsLocalType(type))
        {
            ThrowDecodingError(_u("Invalid global type %u"), type);
        }
        switch (type)
        {
        case WasmTypes::I32: break; // Handled
        case WasmTypes::I64: break; // Handled
        case WasmTypes::F32: break; // Handled
        case WasmTypes::F64: break; // Handled
#ifdef ENABLE_WASM_SIMD
        case WasmTypes::V128: ThrowDecodingError(_u("v128 globals not supported"));
#endif
        default:
            WasmTypes::CompileAssertCases<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
        }
        
        bool isMutable = ReadMutableValue();
        WasmNode globalNode = ReadInitExpr();
        GlobalReferenceTypes::Type refType = GlobalReferenceTypes::Const;
        WasmTypes::WasmType initType;

        switch (globalNode.op) {
        case  wbI32Const: initType = WasmTypes::I32; break;
        case  wbF32Const: initType = WasmTypes::F32; break;
        case  wbF64Const: initType = WasmTypes::F64; break;
        case  wbI64Const: initType = WasmTypes::I64; break;
        case  wbGetGlobal:
            initType = m_module->GetGlobal(globalNode.var.num)->GetType();
            refType = GlobalReferenceTypes::LocalReference;
            break;
        default:
            Assert(UNREACHED);
            ThrowDecodingError(_u("Unknown global init_expr"));
        }
        if (type != initType)
        {
            ThrowDecodingError(_u("Type mismatch for global initialization"));
        }
        m_module->AddGlobal(refType, type, isMutable, globalNode);
    }
}